

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yoml-parser.h
# Opt level: O0

yoml_t * yoml__parse_mapping(yaml_parser_t *parser,yaml_event_t *event,yoml_parse_args_t *parse_args
                            )

{
  yaml_event_type_t local_3c;
  yoml_t *pyStack_38;
  yaml_event_type_t unhandled;
  yoml_t *value;
  yoml_t *key;
  yoml_t *map;
  yoml_parse_args_t *parse_args_local;
  yaml_event_t *event_local;
  yaml_parser_t *parser_local;
  
  map = (yoml_t *)parse_args;
  parse_args_local = (yoml_parse_args_t *)event;
  event_local = (yaml_event_t *)parser;
  key = yoml__new_node(parse_args->filename,YOML_TYPE_MAPPING,0x40,(event->data).scalar.anchor,
                       (event->data).scalar.tag,event);
  (key->data).scalar = (char *)0x0;
  while( true ) {
    value = yoml__parse_node((yaml_parser_t *)event_local,&local_3c,(yoml_parse_args_t *)map);
    if (value == (yoml_t *)0x0) {
      if (local_3c != YAML_MAPPING_END_EVENT) {
        yoml_free(key,(_func_void_ptr_void_ptr_int_size_t *)map->filename);
        key = (yoml_t *)0x0;
      }
      return key;
    }
    pyStack_38 = yoml__parse_node((yaml_parser_t *)event_local,(yaml_event_type_t *)0x0,
                                  (yoml_parse_args_t *)map);
    if (pyStack_38 == (yoml_t *)0x0) break;
    key = (yoml_t *)realloc(key,((key->data).sequence.size + 1) * 0x10 + 0x40);
    *(yoml_t **)((long)&key->data + (key->data).sequence.size * 0x10 + 8) = value;
    *(yoml_t **)((long)&key->data + (key->data).sequence.size * 0x10 + 0x10) = pyStack_38;
    (key->data).scalar = (char *)((key->data).sequence.size + 1);
  }
  yoml_free(key,(_func_void_ptr_void_ptr_int_size_t *)map->filename);
  return (yoml_t *)0x0;
}

Assistant:

static inline yoml_t *yoml__parse_mapping(yaml_parser_t *parser, yaml_event_t *event, yoml_parse_args_t *parse_args)
{
    yoml_t *map = yoml__new_node(parse_args->filename, YOML_TYPE_MAPPING, offsetof(yoml_t, data.mapping.elements),
                                event->data.mapping_start.anchor, event->data.mapping_start.tag, event);

    map->data.mapping.size = 0;

    while (1) {
        yoml_t *key, *value;
        yaml_event_type_t unhandled;
        if ((key = yoml__parse_node(parser, &unhandled, parse_args)) == NULL) {
            if (unhandled == YAML_MAPPING_END_EVENT) {
                break;
            } else {
                yoml_free(map, parse_args->mem_set);
                map = NULL;
                break;
            }
        }
        if ((value = yoml__parse_node(parser, NULL, parse_args)) == NULL) {
            yoml_free(map, parse_args->mem_set);
            map = NULL;
            break;
        }
        map = realloc(map, offsetof(yoml_t, data.mapping.elements) + sizeof(yoml_mapping_element_t) * (map->data.mapping.size + 1));
        map->data.mapping.elements[map->data.mapping.size].key = key;
        map->data.mapping.elements[map->data.mapping.size].value = value;
        ++map->data.mapping.size;
    }

    return map;
}